

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varenaalloc.h
# Opt level: O1

char * __thiscall VArenaAlloc::allocObject(VArenaAlloc *this,uint32_t size,uint32_t alignment)

{
  ulong uVar1;
  
  uVar1 = (ulong)(-(int)this->fCursor & alignment - 1);
  if ((ulong)((long)this->fEnd - (long)this->fCursor) < size + uVar1) {
    ensureSpace(this,size,alignment);
    uVar1 = (ulong)(alignment - 1 & -*(int *)&this->fCursor);
  }
  return this->fCursor + uVar1;
}

Assistant:

char* allocObject(uint32_t size, uint32_t alignment) {
        uintptr_t mask = alignment - 1;
        uintptr_t alignedOffset = (~reinterpret_cast<uintptr_t>(fCursor) + 1) & mask;
        uintptr_t totalSize = size + alignedOffset;
        AssertRelease(totalSize >= size);

        if (totalSize > static_cast<uintptr_t>(fEnd - fCursor)) {
            this->ensureSpace(size, alignment);
            alignedOffset = (~reinterpret_cast<uintptr_t>(fCursor) + 1) & mask;
        }
        return fCursor + alignedOffset;
    }